

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
          (QPodArrayOps<QtCbor::Element> *this,qsizetype i,Element *args)

{
  long lVar1;
  anon_union_8_2_4ee71171_for_Element_0 aVar2;
  anon_union_8_2_4ee71171_for_Element_0 aVar3;
  bool bVar4;
  qsizetype qVar5;
  Element *pEVar6;
  anon_union_8_2_4ee71171_for_Element_0 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QtCbor::Element> *in_RDI;
  long in_FS_OFFSET;
  Element *where;
  GrowthPosition pos;
  bool detach;
  Element tmp;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QtCbor::Element> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QtCbor::Element>::needsDetach(in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QtCbor::Element>::freeSpaceAtEnd
                          ((QArrayDataPointer<QtCbor::Element> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pEVar6 = QArrayDataPointer<QtCbor::Element>::end(in_stack_ffffffffffffffc0);
      pEVar6->field_0 = *in_RDX;
      *(anon_union_8_2_4ee71171_for_Element_0 *)&pEVar6->type = in_RDX[1];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0047eb0d;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QtCbor::Element>::freeSpaceAtBegin
                          ((QArrayDataPointer<QtCbor::Element> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pEVar6 = QArrayDataPointer<QtCbor::Element>::begin
                         ((QArrayDataPointer<QtCbor::Element> *)0x47ea36);
      pEVar6[-1].field_0 = *in_RDX;
      *(anon_union_8_2_4ee71171_for_Element_0 *)&pEVar6[-1].type = in_RDX[1];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0047eb0d;
    }
  }
  aVar2 = *in_RDX;
  aVar3 = in_RDX[1];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QtCbor::Element>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (Element **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pEVar6 = createHole((QPodArrayOps<QtCbor::Element> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar8,uVar7));
  pEVar6->field_0 = aVar2;
  *(anon_union_8_2_4ee71171_for_Element_0 *)&pEVar6->type = aVar3;
LAB_0047eb0d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }